

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

uint32_t __thiscall
choc::text::FloatToStringBuffer<double>::generateDigits
          (FloatToStringBuffer<double> *this,char *buffer,MantissaAndExponent upperBound,
          uint64_t mantissaDiff,uint64_t delta,int *K)

{
  uint64_t tenToPowerNumDigits;
  ulong rest_00;
  uint64_t local_b8;
  uint64_t rest;
  uint32_t digit;
  int numDigits;
  uint64_t p2;
  uint32_t p1;
  MantissaAndExponent one;
  uint32_t length;
  int *K_local;
  uint64_t delta_local;
  uint64_t mantissaDiff_local;
  char *buffer_local;
  MantissaAndExponent upperBound_local;
  
  one.mantissa._0_4_ = (undefined4)upperBound.mantissa;
  one._12_4_ = 0;
  tenToPowerNumDigits = 1L << (-(char)upperBound.mantissa & 0x3fU);
  p2._4_4_ = (uint32_t)((ulong)buffer >> (-(char)upperBound.mantissa & 0x3fU));
  _digit = (int *)((ulong)buffer & tenToPowerNumDigits - 1);
  rest._4_4_ = math::getNumDecimalDigits(p2._4_4_);
  while( true ) {
    rest._0_4_ = p2._4_4_;
    rest._4_4_ = rest._4_4_ + -1;
    switch(rest._4_4_) {
    case 0:
      p2._4_4_ = 0;
      break;
    case 1:
      rest._0_4_ = p2._4_4_ / 10;
      p2._4_4_ = p2._4_4_ % 10;
      break;
    case 2:
      rest._0_4_ = p2._4_4_ / 100;
      p2._4_4_ = p2._4_4_ % 100;
      break;
    case 3:
      rest._0_4_ = p2._4_4_ / 1000;
      p2._4_4_ = p2._4_4_ % 1000;
      break;
    case 4:
      rest._0_4_ = p2._4_4_ / 10000;
      p2._4_4_ = p2._4_4_ % 10000;
      break;
    case 5:
      rest._0_4_ = p2._4_4_ / 100000;
      p2._4_4_ = p2._4_4_ % 100000;
      break;
    case 6:
      rest._0_4_ = p2._4_4_ / 1000000;
      p2._4_4_ = p2._4_4_ % 1000000;
      break;
    case 7:
      rest._0_4_ = p2._4_4_ / 10000000;
      p2._4_4_ = p2._4_4_ % 10000000;
      break;
    case 8:
      rest._0_4_ = p2._4_4_ / 100000000;
      p2._4_4_ = p2._4_4_ % 100000000;
    }
    writeDigitIfNotLeadingZero(this->storage,(uint32_t *)&one.field_0xc,(uint)rest);
    rest_00 = (long)_digit + ((ulong)p2._4_4_ << (-(char)(undefined4)one.mantissa & 0x3fU));
    if (rest_00 <= mantissaDiff) break;
    if (rest._4_4_ == 0) {
      rest._4_4_ = 0;
      K_local = (int *)mantissaDiff;
      do {
        K_local = (int *)((long)K_local * 10);
        rest._4_4_ = rest._4_4_ + -1;
        writeDigitIfNotLeadingZero
                  (this->storage,(uint32_t *)&one.field_0xc,
                   (uint32_t)
                   ((ulong)((long)_digit * 10) >> (-(char)(undefined4)one.mantissa & 0x3fU)));
        _digit = (int *)(tenToPowerNumDigits - 1 & (long)_digit * 10);
      } while (K_local <= _digit);
      *(int *)delta = rest._4_4_ + *(int *)delta;
      if (rest._4_4_ < -8) {
        local_b8 = 0;
      }
      else {
        local_b8 = upperBound._8_8_ * (ulong)powersOf10[-rest._4_4_];
      }
      roundFinalDigit(this->storage,one._12_4_,(uint64_t)K_local,(uint64_t)_digit,
                      tenToPowerNumDigits,local_b8);
      return one._12_4_;
    }
  }
  *(int *)delta = rest._4_4_ + *(int *)delta;
  roundFinalDigit(this->storage,one._12_4_,mantissaDiff,rest_00,
                  (ulong)powersOf10[rest._4_4_] << (-(char)(undefined4)one.mantissa & 0x3fU),
                  upperBound._8_8_);
  return one._12_4_;
}

Assistant:

static uint32_t generateDigits (char* buffer, MantissaAndExponent upperBound, uint64_t mantissaDiff, uint64_t delta, int& K)
    {
        uint32_t length = 0;
        const auto one = MantissaAndExponent { 1ull << -upperBound.exponent, upperBound.exponent };
        auto p1 = static_cast<uint32_t> (upperBound.mantissa >> -one.exponent);
        auto p2 = upperBound.mantissa & (one.mantissa - 1);
        auto numDigits = math::getNumDecimalDigits (p1);

        for (;;)
        {
            auto digit = p1;

            switch (--numDigits)
            {
                case 0:                           p1 = 0;              break;
                case 1:  digit /= powersOf10[1];  p1 %= powersOf10[1]; break;
                case 2:  digit /= powersOf10[2];  p1 %= powersOf10[2]; break;
                case 3:  digit /= powersOf10[3];  p1 %= powersOf10[3]; break;
                case 4:  digit /= powersOf10[4];  p1 %= powersOf10[4]; break;
                case 5:  digit /= powersOf10[5];  p1 %= powersOf10[5]; break;
                case 6:  digit /= powersOf10[6];  p1 %= powersOf10[6]; break;
                case 7:  digit /= powersOf10[7];  p1 %= powersOf10[7]; break;
                case 8:  digit /= powersOf10[8];  p1 %= powersOf10[8]; break;
                default: break;
            }

            writeDigitIfNotLeadingZero (buffer, length, digit);
            auto rest = p2 + (static_cast<uint64_t> (p1) << -one.exponent);

            if (rest <= delta)
            {
                K += numDigits;
                roundFinalDigit (buffer, length, delta, rest, static_cast<uint64_t> (powersOf10[numDigits]) << -one.exponent, mantissaDiff);
                return length;
            }

            if (numDigits == 0)
            {
                for (;;)
                {
                    delta *= 10;
                    p2 *= 10;
                    --numDigits;
                    writeDigitIfNotLeadingZero (buffer, length, static_cast<uint32_t> (p2 >> -one.exponent));
                    p2 &= one.mantissa - 1;

                    if (p2 < delta)
                    {
                        K += numDigits;
                        roundFinalDigit (buffer, length, delta, p2, one.mantissa, numDigits > -9 ? mantissaDiff * powersOf10[-numDigits] : 0);
                        return length;
                    }
                }
            }
        }
    }